

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  CallInfo *pCVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  CallInfo *pCVar4;
  
  if (-8 < newsize) {
    block = L->stack;
    pTVar2 = (StkId)luaM_realloc_(L,block,(long)L->stacksize << 4,(long)newsize * 0x10 + 0x60);
    L->stack = pTVar2;
    L->stacksize = newsize + 6;
    L->stack_last = pTVar2 + newsize;
    L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar2);
    pGVar3 = (GCObject *)&L->openupval;
    while (pGVar3 = (pGVar3->gch).next, pGVar3 != (GCObject *)0x0) {
      (pGVar3->h).metatable = (Table *)((long)pTVar2 + ((long)(pGVar3->h).metatable - (long)block));
      pTVar2 = L->stack;
    }
    pCVar1 = L->ci;
    for (pCVar4 = L->base_ci; pCVar4 <= pCVar1; pCVar4 = pCVar4 + 1) {
      pCVar4->top = (StkId)(((long)pCVar4->top - (long)block) + (long)pTVar2);
      pCVar4->base = (StkId)(((long)pCVar4->base - (long)block) + (long)pTVar2);
      pCVar4->func = (StkId)(((long)pCVar4->func - (long)block) + (long)pTVar2);
    }
    L->base = (StkId)((long)pTVar2 + ((long)L->base - (long)block));
    return;
  }
  luaM_toobig(L);
}

Assistant:

static void luaD_reallocstack(lua_State*L,int newsize){
TValue*oldstack=L->stack;
int realsize=newsize+1+5;
luaM_reallocvector(L,L->stack,L->stacksize,realsize,TValue);
L->stacksize=realsize;
L->stack_last=L->stack+newsize;
correctstack(L,oldstack);
}